

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

portnode_t * P_DelPortalnode(portnode_t *node)

{
  portnode_t *ppVar1;
  portnode_t *ppVar2;
  portnode_t *ppVar3;
  portnode_t **pppVar4;
  
  if (node != (portnode_t *)0x0) {
    ppVar1 = node->m_tprev;
    ppVar2 = node->m_tnext;
    if (ppVar1 != (portnode_t *)0x0) {
      ppVar1->m_tnext = ppVar2;
    }
    if (ppVar2 != (portnode_t *)0x0) {
      ppVar2->m_tprev = ppVar1;
    }
    ppVar1 = node->m_sprev;
    ppVar3 = node->m_snext;
    if (ppVar1 == (portnode_t *)0x0) {
      pppVar4 = &node->m_portal->render_thinglist;
    }
    else {
      pppVar4 = &ppVar1->m_snext;
    }
    *pppVar4 = ppVar3;
    if (ppVar3 != (portnode_t *)0x0) {
      ppVar3->m_sprev = ppVar1;
    }
    node->m_snext = (portnode_t *)headsecnode;
    headsecnode = (msecnode_t *)node;
    return ppVar2;
  }
  return (portnode_t *)0x0;
}

Assistant:

portnode_t *P_DelPortalnode(portnode_t *node)
{
	portnode_t* tp;  // prev node on thing thread
	portnode_t* tn;  // next node on thing thread
	portnode_t* sp;  // prev node on sector thread
	portnode_t* sn;  // next node on sector thread

	if (node)
	{
		// Unlink from the Thing thread. The Thing thread begins at
		// sector_list and not from AActor->touching_sectorlist.

		tp = node->m_tprev;
		tn = node->m_tnext;
		if (tp)
			tp->m_tnext = tn;
		if (tn)
			tn->m_tprev = tp;

		// Unlink from the sector thread. This thread begins at
		// sector_t->touching_thinglist.

		sp = node->m_sprev;
		sn = node->m_snext;
		if (sp)
			sp->m_snext = sn;
		else
			node->m_portal->render_thinglist = sn;
		if (sn)
			sn->m_sprev = sp;

		// Return this node to the freelist (use the same one as for msecnodes, since both types are the same size.)
		P_PutSecnode(reinterpret_cast<msecnode_t *>(node));
		return tn;
	}
	return NULL;
}